

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O2

bool tinyusdz::hasEscapedTripleQuotes(string *str,bool is_double_quote,size_t *n)

{
  ulong uVar1;
  pointer pcVar2;
  size_t sVar3;
  ulong uVar4;
  
  pcVar2 = (str->_M_dataplus)._M_p;
  sVar3 = 0;
  uVar4 = 0;
  do {
    if (str->_M_string_length <= uVar4) {
      if (n != (size_t *)0x0) {
        *n = sVar3;
      }
      return sVar3 != 0;
    }
    if ((pcVar2[uVar4] == '\\') && (uVar1 = uVar4 + 3, uVar1 < str->_M_string_length)) {
      if (is_double_quote) {
        if (((pcVar2[uVar4 + 1] == '\"') && (pcVar2[uVar4 + 2] == '\"')) && (pcVar2[uVar1] == '\"'))
        goto LAB_0020e6f8;
      }
      else if (((pcVar2[uVar4 + 1] == '\'') && (pcVar2[uVar4 + 2] == '\'')) &&
              (pcVar2[uVar1] == '\'')) {
LAB_0020e6f8:
        if (n == (size_t *)0x0) {
          return true;
        }
        sVar3 = sVar3 + 1;
        uVar4 = uVar1;
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

bool hasEscapedTripleQuotes(const std::string &str, bool is_double_quote,
                            size_t *n) {
  size_t count = 0;

  for (size_t i = 0; i < str.size(); i++) {
    if (str[i] == '\\') {
      if (i + 3 < str.size()) {
        if (is_double_quote) {
          if ((str[i + 1] == '"') && (str[i + 2] == '"') &&
              (str[i + 3] == '"')) {
            if (!n) {  // early exit
              return true;
            }

            count++;
            i += 3;
          }
        } else {
          if ((str[i + 1] == '\'') && (str[i + 2] == '\'') &&
              (str[i + 3] == '\'')) {
            if (!n) {  // early exit
              return true;
            }
            count++;
            i += 3;
          }
        }
      }
    }
  }

  if (n) {
    (*n) = count;
  }

  return count > 0;
}